

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t sysbvm_type_createAnonymousAndMetatype(sysbvm_context_t *context)

{
  sysbvm_object_tuple_t *type;
  sysbvm_object_tuple_t *psVar1;
  
  type = sysbvm_context_allocatePointerTuple(context,(context->roots).metatypeType,0x1e);
  type[4].field_1.pointers[0] = 0x1b;
  type[3].field_1.pointers[0] = 0x1db;
  type[4].header.field_0.typePointer = 0xb;
  type[4].header.identityHashAndFlags = 0xb;
  type[4].header.objectSize = 0;
  psVar1 = sysbvm_context_allocatePointerTuple(context,(sysbvm_tuple_t)type,0x1d);
  psVar1[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).anyValueType;
  psVar1[3].field_1.pointers[0] = 0xb;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  *(sysbvm_object_tuple_t **)&type[10].header.identityHashAndFlags = psVar1;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousAndMetatype(sysbvm_context_t *context)
{
    sysbvm_tuple_t metatype = sysbvm_type_createAnonymousMetatype(context);
    sysbvm_type_tuple_t* result = (sysbvm_type_tuple_t*)sysbvm_context_allocatePointerTuple(context, metatype, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_type_tuple_t));
    result->supertype = context->roots.anyValueType;
    result->totalSlotCount = sysbvm_tuple_size_encode(context, 0);
    result->instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    ((sysbvm_metatype_t*)metatype)->thisType = (sysbvm_tuple_t)result;
    return (sysbvm_tuple_t)result;
}